

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t run_filter(archive_read *a,filter_info *flt)

{
  wchar_t wVar1;
  rar5 *rar_00;
  uint8_t *puVar2;
  rar5 *rar;
  wchar_t ret;
  filter_info *flt_local;
  archive_read *a_local;
  
  rar_00 = get_context(a);
  free((rar_00->cstate).filtered_buf);
  puVar2 = (uint8_t *)malloc(flt->block_length);
  (rar_00->cstate).filtered_buf = puVar2;
  if ((rar_00->cstate).filtered_buf == (uint8_t *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate memory for filter data.");
    a_local._4_4_ = L'\xffffffe2';
  }
  else {
    wVar1 = flt->type;
    if (wVar1 == L'\0') {
      rar._4_4_ = run_delta_filter(rar_00,flt);
    }
    else if ((uint)(wVar1 + L'\xffffffff') < 2) {
      rar._4_4_ = run_e8e9_filter(rar_00,flt,(uint)(flt->type == L'\x02'));
    }
    else {
      if (wVar1 != L'\x03') {
        archive_set_error(&a->archive,0x54,"Unsupported filter type: 0x%x",(ulong)(uint)flt->type);
        return L'\xffffffe2';
      }
      rar._4_4_ = run_arm_filter(rar_00,flt);
    }
    if (rar._4_4_ == L'\0') {
      wVar1 = push_data_ready(a,rar_00,(rar_00->cstate).filtered_buf,flt->block_length,
                              (rar_00->cstate).last_write_ptr);
      if (wVar1 == L'\0') {
        (rar_00->cstate).last_write_ptr = flt->block_length + (rar_00->cstate).last_write_ptr;
        a_local._4_4_ = L'\0';
      }
      else {
        archive_set_error(&a->archive,0x16,"Stack overflow when submitting unpacked data");
        a_local._4_4_ = L'\xffffffe2';
      }
    }
    else {
      a_local._4_4_ = rar._4_4_;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int run_filter(struct archive_read* a, struct filter_info* flt) {
	int ret;
	struct rar5* rar = get_context(a);

	free(rar->cstate.filtered_buf);

	rar->cstate.filtered_buf = malloc(flt->block_length);
	if(!rar->cstate.filtered_buf) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate memory for filter data.");
		return ARCHIVE_FATAL;
	}

	switch(flt->type) {
		case FILTER_DELTA:
			ret = run_delta_filter(rar, flt);
			break;

		case FILTER_E8:
			/* fallthrough */
		case FILTER_E8E9:
			ret = run_e8e9_filter(rar, flt,
			    flt->type == FILTER_E8E9);
			break;

		case FILTER_ARM:
			ret = run_arm_filter(rar, flt);
			break;

		default:
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Unsupported filter type: 0x%x", flt->type);
			return ARCHIVE_FATAL;
	}

	if(ret != ARCHIVE_OK) {
		/* Filter has failed. */
		return ret;
	}

	if(ARCHIVE_OK != push_data_ready(a, rar, rar->cstate.filtered_buf,
	    flt->block_length, rar->cstate.last_write_ptr))
	{
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Stack overflow when submitting unpacked data");

		return ARCHIVE_FATAL;
	}

	rar->cstate.last_write_ptr += flt->block_length;
	return ARCHIVE_OK;
}